

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O2

int nghttp2_frame_pack_priority_update(nghttp2_bufs *bufs,nghttp2_extension *frame)

{
  uint8_t **ppuVar1;
  nghttp2_buf_chain *pnVar2;
  uint32_t *puVar3;
  int iVar4;
  uint8_t *buf;
  
  pnVar2 = bufs->head;
  puVar3 = (uint32_t *)frame->payload;
  if ((ulong)((long)(pnVar2->buf).end - (long)(pnVar2->buf).last) < *(long *)(puVar3 + 4) + 4U) {
    __assert_fail("nghttp2_buf_avail(buf) >= 4 + priority_update->field_value_len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                  ,0x395,
                  "int nghttp2_frame_pack_priority_update(nghttp2_bufs *, nghttp2_extension *)");
  }
  buf = (pnVar2->buf).pos + -9;
  (pnVar2->buf).pos = buf;
  nghttp2_frame_pack_frame_hd(buf,&frame->hd);
  nghttp2_put_uint32be((pnVar2->buf).last,*puVar3);
  ppuVar1 = &(pnVar2->buf).last;
  *ppuVar1 = *ppuVar1 + 4;
  iVar4 = nghttp2_bufs_add(bufs,*(void **)(puVar3 + 2),*(size_t *)(puVar3 + 4));
  if (iVar4 == 0) {
    return 0;
  }
  __assert_fail("rv == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                ,0x3a1,"int nghttp2_frame_pack_priority_update(nghttp2_bufs *, nghttp2_extension *)"
               );
}

Assistant:

int nghttp2_frame_pack_priority_update(nghttp2_bufs *bufs,
                                       nghttp2_extension *frame) {
  int rv;
  nghttp2_buf *buf;
  nghttp2_ext_priority_update *priority_update;

  /* This is required with --disable-assert. */
  (void)rv;

  priority_update = frame->payload;

  buf = &bufs->head->buf;

  assert(nghttp2_buf_avail(buf) >= 4 + priority_update->field_value_len);

  buf->pos -= NGHTTP2_FRAME_HDLEN;

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  nghttp2_put_uint32be(buf->last, (uint32_t)priority_update->stream_id);
  buf->last += 4;

  rv = nghttp2_bufs_add(bufs, priority_update->field_value,
                        priority_update->field_value_len);

  assert(rv == 0);

  return 0;
}